

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O1

void __thiscall leveldb::DBTest::DBTest(DBTest *this)

{
  SpecialEnv *pSVar1;
  Env *pEVar2;
  FilterPolicy *pFVar3;
  long *plVar4;
  long *plVar5;
  void *local_a8;
  undefined1 *local_a0 [2];
  undefined1 local_90 [16];
  Options local_80;
  
  (this->dbname_)._M_dataplus._M_p = (pointer)&(this->dbname_).field_2;
  (this->dbname_)._M_string_length = 0;
  (this->dbname_).field_2._M_local_buf[0] = '\0';
  pSVar1 = (SpecialEnv *)operator_new(0x48);
  pEVar2 = Env::Default();
  (pSVar1->super_EnvWrapper).target_ = pEVar2;
  (pSVar1->super_EnvWrapper).super_Env._vptr_Env = (_func_int **)&PTR__EnvWrapper_0015b988;
  (pSVar1->random_read_counter_).mu_.mu_.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(pSVar1->random_read_counter_).mu_.mu_.super___mutex_base._M_mutex + 8) = 0
  ;
  *(undefined8 *)((long)&(pSVar1->random_read_counter_).mu_.mu_.super___mutex_base._M_mutex + 0x10)
       = 0;
  (pSVar1->random_read_counter_).mu_.mu_.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  *(undefined8 *)
   ((long)&(pSVar1->random_read_counter_).mu_.mu_.super___mutex_base._M_mutex.__data.__list.__prev +
   4) = 0;
  *(undefined8 *)
   ((long)&(pSVar1->random_read_counter_).mu_.mu_.super___mutex_base._M_mutex.__data.__list.__next +
   4) = 0;
  pSVar1->delay_data_sync_ = (__atomic_base<bool>)0x0;
  pSVar1->data_sync_error_ = (__atomic_base<bool>)0x0;
  pSVar1->no_space_ = (__atomic_base<bool>)0x0;
  pSVar1->non_writable_ = (__atomic_base<bool>)0x0;
  pSVar1->non_writable_ = (__atomic_base<bool>)0x0;
  pSVar1->manifest_sync_error_ = (__atomic_base<bool>)0x0;
  pSVar1->manifest_write_error_ = (__atomic_base<bool>)0x0;
  pSVar1->count_random_reads_ = false;
  this->env_ = pSVar1;
  Options::Options(&this->last_options_);
  this->option_config_ = 0;
  pFVar3 = NewBloomFilterPolicy(10);
  this->filter_policy_ = pFVar3;
  test::TmpDir_abi_cxx11_();
  plVar4 = (long *)std::__cxx11::string::append((char *)local_a0);
  plVar5 = plVar4 + 2;
  if ((Env **)*plVar4 == (Env **)plVar5) {
    local_80.env = (Env *)*plVar5;
    local_80.info_log = (Logger *)plVar4[3];
    local_80.comparator = (Comparator *)&local_80.env;
  }
  else {
    local_80.env = (Env *)*plVar5;
    local_80.comparator = (Comparator *)*plVar4;
  }
  local_80._8_8_ = plVar4[1];
  *plVar4 = (long)plVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::string::operator=((string *)this,(string *)&local_80);
  if (local_80.comparator != (Comparator *)&local_80.env) {
    operator_delete(local_80.comparator);
  }
  if (local_a0[0] != local_90) {
    operator_delete(local_a0[0]);
  }
  Options::Options(&local_80);
  DestroyDB((leveldb *)&local_a8,&this->dbname_,&local_80);
  if (local_a8 != (void *)0x0) {
    operator_delete__(local_a8);
  }
  this->db_ = (DB *)0x0;
  Reopen(this,(Options *)0x0);
  return;
}

Assistant:

DBTest() : env_(new SpecialEnv(Env::Default())), option_config_(kDefault) {
    filter_policy_ = NewBloomFilterPolicy(10);
    dbname_ = test::TmpDir() + "/db_test";
    DestroyDB(dbname_, Options());
    db_ = nullptr;
    Reopen();
  }